

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenerateVerifierType_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  string sStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  Type local_38;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) &&
     ((0x64000U >> (BVar1 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    local_38.base_type = (field->value).type.element;
    local_38.fixed_length = (field->value).type.fixed_length;
    local_38.element = BASE_TYPE_NONE;
    local_38.struct_def = (field->value).type.struct_def;
    local_38.enum_def = (field->value).type.enum_def;
    GenerateNestedVerifierTypes_abi_cxx11_(&local_58,this,&local_38);
    std::operator+(&local_b8,"ForwardOffset<Vector<",&local_58);
    std::operator+(&local_98,&local_b8,", ");
    GenType_abi_cxx11_(&sStack_d8,this,&local_38,false);
    std::operator+(&local_78,&local_98,&sStack_d8);
    std::operator+(__return_storage_ptr__,&local_78,">>");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&sStack_d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    GenerateNestedVerifierTypes_abi_cxx11_(__return_storage_ptr__,this,&(field->value).type);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateVerifierType(const FieldDef &field) {
    const auto type = field.value.type;
    const auto is_vector = IsVector(type) || IsArray(type);

    if (is_vector) {
      const auto vector_type = field.value.type.VectorType();
      return "ForwardOffset<Vector<" +
             GenerateNestedVerifierTypes(vector_type) + ", " +
             GenType(vector_type) + ">>";
    }

    return GenerateNestedVerifierTypes(field.value.type);
  }